

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

void matchit::impl::IdUtil<mathiu::impl::Difference>::bindValue<mathiu::impl::Difference_const&>
               (Difference *v,Difference *value)

{
  Difference *local_50;
  variant<std::monostate,_mathiu::impl::Difference,_mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*>
  local_48;
  Difference *local_20;
  Difference *value_local;
  ValueVariant<mathiu::impl::Difference> *v_local;
  
  local_50 = value;
  local_20 = value;
  value_local = v;
  std::
  variant<std::monostate,mathiu::impl::Difference,mathiu::impl::Difference*,mathiu::impl::Difference_const*>
  ::variant<mathiu::impl::Difference_const*,void,void,mathiu::impl::Difference_const*,void>
            ((variant<std::monostate,mathiu::impl::Difference,mathiu::impl::Difference*,mathiu::impl::Difference_const*>
              *)&local_48,&local_50);
  std::
  variant<std::monostate,_mathiu::impl::Difference,_mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*>
  ::operator=((variant<std::monostate,_mathiu::impl::Difference,_mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*>
               *)value_local,&local_48);
  std::
  variant<std::monostate,_mathiu::impl::Difference,_mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*>
  ::~variant(&local_48);
  return;
}

Assistant:

constexpr static auto bindValue(ValueVariant<Type> &v, Value &&value,
                                                    std::true_type /* StorePointer */)
            {
                v = ValueVariant<Type>{&value};
            }